

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O0

void __thiscall BossaConfig::BossaConfig(BossaConfig *this)

{
  BossaConfig *this_local;
  
  this->_vptr_BossaConfig = (_func_int **)&PTR__BossaConfig_00127f58;
  std::__cxx11::string::string((string *)&this->portArg);
  std::__cxx11::string::string((string *)&this->lockArg);
  std::__cxx11::string::string((string *)&this->unlockArg);
  this->erase = false;
  this->write = false;
  this->read = false;
  this->verify = false;
  this->port = false;
  this->boot = false;
  this->bod = false;
  this->bor = false;
  this->lock = false;
  this->security = false;
  this->info = false;
  this->usbPort = false;
  this->arduinoErase = false;
  this->help = false;
  this->version = false;
  this->readArg = 0;
  this->offsetArg = 0;
  this->bootArg = 1;
  this->bodArg = 1;
  this->borArg = 1;
  this->usbPortArg = true;
  this->reset = false;
  return;
}

Assistant:

BossaConfig::BossaConfig()
{
    erase = false;
    write = false;
    read = false;
    verify = false;
    port = false;
    boot = false;
    bod = false;
    bor = false;
    lock = false;
    security = false;
    info = false;
    usbPort = false;
    arduinoErase = false;
    help = false;
    version = false;

    readArg = 0;
    offsetArg = 0;
    bootArg = 1;
    bodArg = 1;
    borArg = 1;
    usbPortArg=1;

    reset = false;
}